

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

LogLevel __thiscall cmake::StringToLogLevel(cmake *this,string_view levelStr)

{
  bool bVar1;
  LogLevel LVar2;
  long lStack_80;
  allocator<char> local_69;
  string local_68;
  string levelStrLowCase;
  string_view levelStr_local;
  
  levelStr_local._M_str = (char *)levelStr._M_len;
  levelStr_local._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_68,&levelStr_local,&local_69);
  cmsys::SystemTools::LowerCase(&levelStrLowCase,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  local_68._M_dataplus._M_p = (pointer)&levelStrLowCase;
  for (lStack_80 = 0;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_68,
                           (pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>
                            *)((anonymous_namespace)::getStringToLogLevelPairs()::levels + lStack_80
                              )), lStack_80 != 0x60; lStack_80 = lStack_80 + 0x60) {
    if (bVar1) goto LAB_001de547;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_68,
                         (pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>
                          *)((anonymous_namespace)::getStringToLogLevelPairs()::levels +
                            lStack_80 + 0x18));
    if (bVar1) {
      lStack_80 = lStack_80 + 0x18;
      goto LAB_001de547;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_68,
                         (pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>
                          *)((anonymous_namespace)::getStringToLogLevelPairs()::levels +
                            lStack_80 + 0x30));
    if (bVar1) {
      lStack_80 = lStack_80 + 0x30;
      goto LAB_001de547;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_68,
                         (pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>
                          *)((anonymous_namespace)::getStringToLogLevelPairs()::levels +
                            lStack_80 + 0x48));
    if (bVar1) {
      LVar2 = LOG_UNDEFINED;
      if (lStack_80 == 0x60) goto LAB_001de54c;
      lStack_80 = lStack_80 + 0x48;
      goto LAB_001de547;
    }
  }
  if (bVar1) {
    lStack_80 = 0x60;
  }
  else {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_68,
                         (pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>
                          *)((anonymous_namespace)::getStringToLogLevelPairs()::levels + 0x78));
    if (bVar1) {
      lStack_80 = 0x78;
    }
    else {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_68,
                           (pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>
                            *)((anonymous_namespace)::getStringToLogLevelPairs()::levels + 0x90));
      lStack_80 = 0x90;
      if (!bVar1) {
        LVar2 = LOG_UNDEFINED;
        goto LAB_001de54c;
      }
    }
  }
LAB_001de547:
  LVar2 = *(LogLevel *)
           ((anonymous_namespace)::getStringToLogLevelPairs()::levels + lStack_80 + 0x10);
LAB_001de54c:
  std::__cxx11::string::~string((string *)&levelStrLowCase);
  return LVar2;
}

Assistant:

Message::LogLevel cmake::StringToLogLevel(cm::string_view levelStr)
{
  const LevelsPairArray& levels = getStringToLogLevelPairs();

  const auto levelStrLowCase =
    cmSystemTools::LowerCase(std::string{ levelStr });

  // NOLINTNEXTLINE(readability-qualified-auto)
  const auto it = std::find_if(levels.cbegin(), levels.cend(),
                               [&levelStrLowCase](const LevelsPair& p) {
                                 return p.first == levelStrLowCase;
                               });
  return (it != levels.cend()) ? it->second : Message::LogLevel::LOG_UNDEFINED;
}